

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

void __thiscall cppnet::TimerContainer::~TimerContainer(TimerContainer *this)

{
  TimerContainer *this_local;
  
  (this->super_Timer)._vptr_Timer = (_func_int **)&PTR_AddTimer_0016ba38;
  std::
  unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
  ::~unordered_map(&this->_timer_wheel);
  std::shared_ptr<cppnet::TimerContainer>::~shared_ptr(&this->_sub_timer);
  std::weak_ptr<cppnet::TimerContainer>::~weak_ptr(&this->_root_timer);
  Bitmap::~Bitmap(&this->_bitmap);
  Timer::~Timer(&this->super_Timer);
  return;
}

Assistant:

TimerContainer::~TimerContainer() {

}